

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QMatchData * __thiscall
QMap<QString,_QMatchData>::take(QMap<QString,_QMatchData> *this,QString *key)

{
  bool bVar1;
  QMatchData *in_RDI;
  long in_FS_OFFSET;
  node_type node;
  QMap<QString,_QMatchData> copy;
  QMatchData *in_stack_ffffffffffffff98;
  QMatchData *this_00;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
                      *)0xa71d11);
  if (bVar1) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
            ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
                        *)in_RDI);
    if (bVar1) {
      QMap((QMap<QString,_QMatchData> *)in_RDI,
           (QMap<QString,_QMatchData> *)in_stack_ffffffffffffff98);
    }
    else {
      memset(&local_10,0,8);
      QMap((QMap<QString,_QMatchData> *)0xa71d6c);
    }
    detach((QMap<QString,_QMatchData> *)in_RDI);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
                  *)0xa71da4);
    std::
    map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
    ::extract((map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
               *)this_00,(key_type *)in_RDI);
    bVar1 = std::_Node_handle_common::operator_cast_to_bool((_Node_handle_common *)&local_28);
    if (bVar1) {
      std::
      _Node_handle<QString,_std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
      ::mapped((_Node_handle<QString,_std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
                *)in_RDI);
      QMatchData::QMatchData(in_RDI,in_stack_ffffffffffffff98);
    }
    std::
    _Node_handle<QString,_std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
    ::~_Node_handle((_Node_handle<QString,_std::pair<const_QString,_QMatchData>,_std::allocator<std::_Rb_tree_node<std::pair<const_QString,_QMatchData>_>_>_>
                     *)0xa71dfd);
    if (!bVar1) {
      QMatchData::QMatchData(in_RDI);
    }
    ~QMap((QMap<QString,_QMatchData> *)0xa71e23);
  }
  else {
    QMatchData::QMatchData(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

T take(const Key &key)
    {
        if (!d)
            return T();

        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. There is no need of copying all the
        // elements (the one to be removed can be skipped).
        detach();

#ifdef __cpp_lib_node_extract
        if (const auto node = d->m.extract(key))
            return std::move(node.mapped());
#else
        auto i = d->m.find(key);
        if (i != d->m.end()) {
            // ### breaks RVO on most compilers (but only on old-fashioned ones, so who cares?)
            T result(std::move(i->second));
            d->m.erase(i);
            return result;
        }
#endif
        return T();
    }